

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O3

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeQuad>::ComputeSolutionHCurlT<std::complex<double>>
          (TPZCompElHCurl<pzshape::TPZShapeQuad> *this,TPZFMatrix<double> *phiHCurl,
          TPZFMatrix<double> *curlPhi,TPZSolVec<std::complex<double>_> *sol,
          TPZSolVec<std::complex<double>_> *curlSol)

{
  undefined8 *puVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  TPZManVector<std::complex<double>,_10> *pTVar5;
  TNode *pTVar6;
  long lVar7;
  long lVar8;
  complex<double> *pcVar9;
  complex<double> *pcVar10;
  double dVar11;
  double dVar12;
  bool bVar13;
  int iVar14;
  long *plVar15;
  TPZCompMesh *pTVar16;
  TPZFMatrix<std::complex<double>_> *pTVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  int iVar23;
  long lVar24;
  double extraout_XMM0_Qa;
  long local_a8;
  
  plVar15 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                           super_TPZCompEl + 0xb8))();
  (**(code **)(*plVar15 + 0x78))(plVar15);
  iVar14 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                  super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                  super_TPZCompEl + 0x90))(this);
  pTVar16 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar17 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar16->fSolution);
  lVar4 = (pTVar17->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  (*(sol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>)._vptr_TPZVec[3])(sol,lVar4);
  (*(curlSol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>)._vptr_TPZVec[3])(curlSol,lVar4)
  ;
  if (0 < lVar4) {
    lVar20 = 0;
    do {
      pTVar5 = (sol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore;
      (*pTVar5[lVar20].super_TPZVec<std::complex<double>_>._vptr_TPZVec[3])(pTVar5 + lVar20,2);
      pTVar5 = (sol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore;
      lVar18 = pTVar5[lVar20].super_TPZVec<std::complex<double>_>.fNElements;
      if (0 < lVar18) {
        lVar19 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((pTVar5[lVar20].super_TPZVec<std::complex<double>_>.fStore)->_M_value + lVar19);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar19 = lVar19 + 0x10;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      pTVar5 = (curlSol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore;
      (*pTVar5[lVar20].super_TPZVec<std::complex<double>_>._vptr_TPZVec[3])(pTVar5 + lVar20,1);
      pTVar5 = (curlSol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore;
      lVar18 = pTVar5[lVar20].super_TPZVec<std::complex<double>_>.fNElements;
      if (0 < lVar18) {
        lVar19 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((pTVar5[lVar20].super_TPZVec<std::complex<double>_>.fStore)->_M_value + lVar19);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar19 = lVar19 + 0x10;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar4);
  }
  pTVar16 = TPZCompEl::Mesh((TPZCompEl *)this);
  if (0 < iVar14) {
    lVar20 = 0;
    iVar23 = 0;
    do {
      lVar18 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0xa8))(this,iVar23);
      pTVar6 = (pTVar16->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      lVar19 = (long)pTVar6[*(int *)(lVar18 + 8)].dim;
      if (0 < lVar19) {
        iVar3 = pTVar6[*(int *)(lVar18 + 8)].pos;
        lVar20 = (long)(int)lVar20;
        local_a8 = 0;
        do {
          if (0 < lVar4) {
            lVar18 = local_a8 + iVar3;
            lVar24 = 0;
            do {
              lVar21 = 0;
              bVar13 = true;
              do {
                bVar22 = bVar13;
                if (((lVar18 < 0) ||
                    (lVar7 = (pTVar17->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                             fRow, lVar7 <= lVar18)) ||
                   ((pTVar17->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                    lVar24)) {
                  TPZFMatrix<std::complex<double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                dVar11 = *(double *)(pTVar17->fElem[lVar7 * lVar24 + lVar18]._M_value + 8);
                if (((lVar20 < 0) ||
                    (lVar8 = (phiHCurl->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
                    lVar8 <= lVar20)) ||
                   ((phiHCurl->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar21)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x278);
                }
                pcVar9 = (sol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore[lVar24]
                         .super_TPZVec<std::complex<double>_>.fStore;
                dVar2 = phiHCurl->fElem[lVar8 * lVar21 + lVar20];
                pcVar10 = pcVar9 + lVar21;
                dVar12 = *(double *)(pcVar10->_M_value + 8);
                pcVar9 = pcVar9 + lVar21;
                *(double *)pcVar9->_M_value =
                     *(double *)pcVar10->_M_value +
                     *(double *)pTVar17->fElem[lVar7 * lVar24 + lVar18]._M_value * dVar2;
                *(double *)(pcVar9->_M_value + 8) = dVar12 + dVar11 * dVar2;
                lVar21 = 1;
                bVar13 = false;
              } while (bVar22);
              if (((lVar18 < 0) ||
                  (lVar21 = (pTVar17->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                            fRow, lVar21 <= lVar18)) ||
                 ((pTVar17->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                  lVar24)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              dVar11 = *(double *)pTVar17->fElem[lVar21 * lVar24 + lVar18]._M_value;
              dVar2 = *(double *)(pTVar17->fElem[lVar21 * lVar24 + lVar18]._M_value + 8);
              (*(curlPhi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x21])(curlPhi,0,lVar20);
              pcVar10 = (curlSol->super_TPZVec<TPZManVector<std::complex<double>,_10>_>).fStore
                        [lVar24].super_TPZVec<std::complex<double>_>.fStore;
              dVar12 = *(double *)(pcVar10->_M_value + 8);
              *(double *)pcVar10->_M_value =
                   *(double *)pcVar10->_M_value + extraout_XMM0_Qa * dVar11;
              *(double *)(pcVar10->_M_value + 8) = dVar12 + extraout_XMM0_Qa * dVar2;
              lVar24 = lVar24 + 1;
            } while (lVar24 != lVar4);
          }
          lVar20 = lVar20 + 1;
          local_a8 = local_a8 + 1;
        } while (local_a8 != lVar19);
      }
      iVar23 = iVar23 + 1;
    } while (iVar23 != iVar14);
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::ComputeSolutionHCurlT(
  const TPZFMatrix<REAL> &phiHCurl, const TPZFMatrix<REAL> &curlPhi,
    TPZSolVec<TVar> &sol, TPZSolVec<TVar> &curlSol)
{
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curlDim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nVar = this->Material()->NStateVariables();
    const int nConnects = this->NConnects();

    TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();

    long numberSol = meshSol.Cols();
#ifdef PZDEBUG
    if (numberSol != 1 || nVar != 1) {
        DebugStop();
    }
#endif

    sol.Resize(numberSol);
    curlSol.Resize(numberSol);

    for (long iSol = 0; iSol < numberSol; iSol++) {
        sol[iSol].Resize(dim);
        sol[iSol].Fill(0);
        curlSol[iSol].Resize(curlDim);
        curlSol[iSol].Fill(0);
    }

    TPZBlock &block = this->Mesh()->Block();
    int ishape = 0;
    for (int iCon = 0; iCon < nConnects; iCon++) {
        TPZConnect *con = &this->Connect(iCon);
        const auto conSeqN = con->SequenceNumber();
        const auto nShapeCon = block.Size(conSeqN);
        const auto pos = block.Position(conSeqN);

        for (int jShape = 0; jShape < nShapeCon; jShape++) {

            for (long iSol = 0; iSol < numberSol; iSol++) {
                for (int coord = 0; coord < dim; coord++) {
                    sol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * phiHCurl(ishape, coord);
                }
                for (int coord = 0; coord < curlDim; coord++) {
                    curlSol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * curlPhi.Get(coord, ishape);
                }
            }
            ishape++;
        }
    }
}